

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O2

void leccalc::processinputfile
               (uint *samplesize,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *event_to_periods,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,bool useReturnPeriodFile,aggreports *agg)

{
  size_t sVar1;
  const_iterator cVar2;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  
  checkinputfile(samplesize,(FILE *)_stdin,agg);
  sVar1 = 1;
  do {
    while( true ) {
      if ((sVar1 == 0) || (sVar1 = fread(&sh,0xc,1,_stdin), sVar1 != 1)) {
        return;
      }
      cVar2 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&event_to_periods->_M_t,&sh.event_id);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(event_to_periods->_M_t)._M_impl.super__Rb_tree_header) break;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 summaryids,&sh.summary_id);
      while ((sVar1 = fread(&sr,8,1,_stdin), sVar1 == 1 && (sr.sidx != 0))) {
        if ((1 < sr.sidx + 5U) && (0.0 < sr.loss || useReturnPeriodFile)) {
          dolecoutputaggsummary
                    (sh.summary_id,sr.sidx,sr.loss,
                     (vector<int,_std::allocator<int>_> *)&cVar2._M_node[1]._M_parent,out_loss);
        }
      }
    }
    do {
      sVar1 = fread(&sr,8,1,_stdin);
      if (sVar1 != 1) break;
    } while (sr.sidx != 0);
  } while( true );
}

Assistant:

void processinputfile(
		unsigned int& samplesize,
		const std::map<int, std::vector<int> >& event_to_periods,
		std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const bool useReturnPeriodFile, aggreports &agg)
	{
		checkinputfile(samplesize, stdin, agg);

		// read_event()
		size_t i = 1;
		while (i != 0) {
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			if (i != 1) {
				break;
			}

			// discard samples if eventis not found
			std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
			if (iter == event_to_periods.end()) { // Event not found so don't process it, but read samples
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, stdin);
					if (i != 1 || sr.sidx == 0) {
						break;
					}
				}
				continue;
			}

			summaryids.insert(sh.summary_id);

			// read_samples_and_compute_lec()
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i != 1) {
					break;
				}

				if (sr.sidx == 0) {			//  end of sidx stream
					break;
				}

				if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) {
					continue;
				}

				if (sr.loss > 0.0 || useReturnPeriodFile)
				{
					dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
				}
			}
		}
	}